

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

Option * __thiscall CLI::Option::expected(Option *this,int value)

{
  IncorrectConstruction *pIVar1;
  string local_98;
  undefined1 local_71;
  string local_70;
  undefined1 local_4d;
  string local_40;
  int local_1c;
  Option *pOStack_18;
  int value_local;
  Option *this_local;
  
  if (this->expected_ != value) {
    local_1c = value;
    pOStack_18 = this;
    if (value == 0) {
      local_4d = 1;
      pIVar1 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
      single_name_abi_cxx11_(&local_40,this);
      IncorrectConstruction::Set0Opt(pIVar1,&local_40);
      local_4d = 0;
      __cxa_throw(pIVar1,&IncorrectConstruction::typeinfo,
                  IncorrectConstruction::~IncorrectConstruction);
    }
    if ((this->changeable_ & 1U) == 0) {
      local_71 = 1;
      pIVar1 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
      single_name_abi_cxx11_(&local_70,this);
      IncorrectConstruction::ChangeNotVector(pIVar1,&local_70);
      local_71 = 0;
      __cxa_throw(pIVar1,&IncorrectConstruction::typeinfo,
                  IncorrectConstruction::~IncorrectConstruction);
    }
    if ((value != 1) && ((this->super_OptionBase<CLI::Option>).multi_option_policy_ != Throw)) {
      pIVar1 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
      single_name_abi_cxx11_(&local_98,this);
      IncorrectConstruction::AfterMultiOpt(pIVar1,&local_98);
      __cxa_throw(pIVar1,&IncorrectConstruction::typeinfo,
                  IncorrectConstruction::~IncorrectConstruction);
    }
    this->expected_ = value;
  }
  return this;
}

Assistant:

Option *expected(int value) {
        if(expected_ == value)
            return this;
        else if(value == 0)
            throw IncorrectConstruction::Set0Opt(single_name());
        else if(!changeable_)
            throw IncorrectConstruction::ChangeNotVector(single_name());
        else if(value != 1 && multi_option_policy_ != MultiOptionPolicy::Throw)
            throw IncorrectConstruction::AfterMultiOpt(single_name());

        expected_ = value;
        return this;
    }